

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

size_t read_part_content(curl_mimepart *part,char *buffer,size_t bufsize,_Bool *hasread)

{
  curl_off_t *pcVar1;
  void *pvVar2;
  curl_mimepart *pcVar3;
  curl_read_callback p_Var4;
  int iVar5;
  size_t offset;
  ulong __n;
  size_t sVar6;
  long lVar7;
  char *__src;
  size_t sVar8;
  
  sVar8 = part->lastreadstatus;
  if (sVar8 + 1 < 2) {
    return sVar8;
  }
  if (sVar8 - 0x10000000 < 2) {
    return sVar8;
  }
  if ((part->datasize == -1) || ((part->state).offset < part->datasize)) {
    if (part->kind != MIMEKIND_FILE) {
      if (part->kind == MIMEKIND_MULTIPART) {
        if (bufsize == 0) goto LAB_006e1608;
        pvVar2 = part->arg;
        sVar8 = 0;
        do {
          __n = 0;
          if (*(uint *)((long)pvVar2 + 0x48) < 9) {
            pcVar3 = *(curl_mimepart **)((long)pvVar2 + 0x50);
            switch(*(uint *)((long)pvVar2 + 0x48)) {
            case 0:
            case 4:
              *(undefined4 *)((long)pvVar2 + 0x48) = 5;
              *(undefined8 *)((long)pvVar2 + 0x50) = *(undefined8 *)((long)pvVar2 + 8);
              *(undefined8 *)((long)pvVar2 + 0x58) = 2;
LAB_006e1439:
              __n = 0;
              break;
            case 5:
              sVar6 = curlx_sotouz(*(curl_off_t *)((long)pvVar2 + 0x58));
              if (sVar6 < 4) {
                __src = "\r\n--" + sVar6;
                __n = 4 - sVar6;
                if (bufsize <= 4 - sVar6) {
                  __n = bufsize;
                }
                goto LAB_006e1536;
              }
              *(undefined4 *)((long)pvVar2 + 0x48) = 6;
LAB_006e1577:
              *(curl_mimepart **)((long)pvVar2 + 0x50) = pcVar3;
LAB_006e157b:
              *(undefined8 *)((long)pvVar2 + 0x58) = 0;
              __n = 0;
              break;
            case 6:
              sVar6 = curlx_sotouz(*(curl_off_t *)((long)pvVar2 + 0x58));
              if (pcVar3 == (curl_mimepart *)0x0) {
                if (sVar6 < 0x2e) goto LAB_006e151b;
                if (3 < sVar6 - 0x2e) goto LAB_006e1570;
                __src = "multipart/form-data" + sVar6 + 1;
                lVar7 = 0x32;
              }
              else if (sVar6 < 0x2e) {
LAB_006e151b:
                __src = (char *)((long)pvVar2 + sVar6 + 0x18);
                lVar7 = 0x2e;
              }
              else {
                if (1 < sVar6 - 0x2e) {
LAB_006e1570:
                  *(undefined4 *)((long)pvVar2 + 0x48) = 7;
                  goto LAB_006e1577;
                }
                __src = "\" has source files which vary by configuration. This is not supported by the \""
                        + sVar6 + 0x3f;
                lVar7 = 0x30;
              }
              __n = lVar7 - sVar6;
              if (bufsize <= lVar7 - sVar6) {
                __n = bufsize;
              }
LAB_006e1536:
              memcpy(buffer,__src,__n);
              *(long *)((long)pvVar2 + 0x58) = *(long *)((long)pvVar2 + 0x58) + __n;
              break;
            case 7:
              if (pcVar3 == (curl_mimepart *)0x0) {
                *(undefined4 *)((long)pvVar2 + 0x48) = 8;
                *(undefined8 *)((long)pvVar2 + 0x50) = 0;
                *(undefined8 *)((long)pvVar2 + 0x58) = 0;
                goto LAB_006e1439;
              }
              __n = readback_part(pcVar3,buffer,bufsize,hasread);
              if (__n == 0) {
                pcVar3 = pcVar3->nextpart;
                *(undefined4 *)((long)pvVar2 + 0x48) = 5;
                *(curl_mimepart **)((long)pvVar2 + 0x50) = pcVar3;
                goto LAB_006e157b;
              }
              if ((__n - 0x10000000 < 2) || (__n + 2 < 2)) {
                if (sVar8 == 0) {
                  sVar8 = __n;
                }
                goto switchD_006e1420_caseD_8;
              }
              break;
            case 8:
              goto switchD_006e1420_caseD_8;
            }
          }
          sVar8 = sVar8 + __n;
          buffer = buffer + __n;
          bufsize = bufsize - __n;
        } while (bufsize != 0);
      }
      else {
LAB_006e15af:
        p_Var4 = part->readfunc;
        if (p_Var4 == (curl_read_callback)0x0) goto LAB_006e1608;
        if ((part->flags & 4) == 0) {
          if (*hasread != false) {
            return 0xfffffffffffffffe;
          }
          *hasread = true;
        }
        sVar8 = (*p_Var4)(buffer,1,bufsize,part->arg);
      }
switchD_006e1420_caseD_8:
      if ((1 < sVar8 + 1) && (1 < sVar8 - 0x10000000)) {
        if (sVar8 == 0xfffffffffffffffe) {
          return 0xfffffffffffffffe;
        }
        pcVar1 = &(part->state).offset;
        *pcVar1 = *pcVar1 + sVar8;
      }
      goto LAB_006e160b;
    }
    if (((FILE *)part->fp == (FILE *)0x0) || (iVar5 = feof((FILE *)part->fp), iVar5 == 0))
    goto LAB_006e15af;
  }
LAB_006e1608:
  sVar8 = 0;
LAB_006e160b:
  part->lastreadstatus = sVar8;
  return sVar8;
}

Assistant:

static size_t read_part_content(curl_mimepart *part,
                                char *buffer, size_t bufsize, bool *hasread)
{
  size_t sz = 0;

  switch(part->lastreadstatus) {
  case 0:
  case CURL_READFUNC_ABORT:
  case CURL_READFUNC_PAUSE:
  case READ_ERROR:
    return part->lastreadstatus;
  default:
    break;
  }

  /* If we can determine we are at end of part data, spare a read. */
  if(part->datasize != (curl_off_t) -1 &&
     part->state.offset >= part->datasize) {
    /* sz is already zero. */
  }
  else {
    switch(part->kind) {
    case MIMEKIND_MULTIPART:
      /*
       * Cannot be processed as other kinds since read function requires
       * an additional parameter and is highly recursive.
       */
       sz = mime_subparts_read(buffer, 1, bufsize, part->arg, hasread);
       break;
    case MIMEKIND_FILE:
      if(part->fp && feof(part->fp))
        break;  /* At EOF. */
      FALLTHROUGH();
    default:
      if(part->readfunc) {
        if(!(part->flags & MIME_FAST_READ)) {
          if(*hasread)
            return STOP_FILLING;
          *hasread = TRUE;
        }
        sz = part->readfunc(buffer, 1, bufsize, part->arg);
      }
      break;
    }
  }

  switch(sz) {
  case STOP_FILLING:
    break;
  case 0:
  case CURL_READFUNC_ABORT:
  case CURL_READFUNC_PAUSE:
  case READ_ERROR:
    part->lastreadstatus = sz;
    break;
  default:
    part->state.offset += sz;
    part->lastreadstatus = sz;
    break;
  }

  return sz;
}